

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void free_context(mg_context *ctx)

{
  _func_void_mg_context_ptr *p_Var1;
  mg_handler_info *__ptr;
  long lVar2;
  
  p_Var1 = (ctx->callbacks).exit_context;
  if (p_Var1 != (_func_void_mg_context_ptr *)0x0) {
    (*p_Var1)(ctx);
  }
  pthread_mutex_destroy((pthread_mutex_t *)&ctx->thread_mutex);
  pthread_cond_destroy((pthread_cond_t *)&ctx->sq_empty);
  pthread_cond_destroy((pthread_cond_t *)&ctx->sq_full);
  free(ctx->squeue);
  pthread_mutex_destroy((pthread_mutex_t *)&ctx->nonce_mutex);
  lVar2 = 0x5076;
  do {
    if (*(void **)(&ctx->context_type + lVar2 * 2) != (void *)0x0) {
      free(*(void **)(&ctx->context_type + lVar2 * 2));
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x50b0);
  while (__ptr = (ctx->dd).handlers, __ptr != (mg_handler_info *)0x0) {
    (ctx->dd).handlers = __ptr->next;
    free(__ptr->uri);
    free(__ptr);
  }
  free(ctx->worker_threadids);
  free(ctx->worker_connections);
  free(ctx->systemName);
  free(ctx);
  return;
}

Assistant:

static void
free_context(struct mg_context *ctx)
{
	int i;
	struct mg_handler_info *tmp_rh;

	if (ctx == NULL) {
		return;
	}

	/* Call user callback */
	if (ctx->callbacks.exit_context) {
		ctx->callbacks.exit_context(ctx);
	}

	/* All threads exited, no sync is needed. Destroy thread mutex and
	 * condvars
	 */
	(void)pthread_mutex_destroy(&ctx->thread_mutex);

#if defined(ALTERNATIVE_QUEUE)
	mg_free(ctx->client_socks);
	if (ctx->client_wait_events != NULL) {
		for (i = 0; (unsigned)i < ctx->cfg_worker_threads; i++) {
			event_destroy(ctx->client_wait_events[i]);
		}
		mg_free(ctx->client_wait_events);
	}
#else
	(void)pthread_cond_destroy(&ctx->sq_empty);
	(void)pthread_cond_destroy(&ctx->sq_full);
	mg_free(ctx->squeue);
#endif

	/* Destroy other context global data structures mutex */
	(void)pthread_mutex_destroy(&ctx->nonce_mutex);

#if defined(USE_LUA)
	(void)pthread_mutex_destroy(&ctx->lua_bg_mutex);
#endif

	/* Deallocate config parameters */
	for (i = 0; i < NUM_OPTIONS; i++) {
		if (ctx->dd.config[i] != NULL) {
#if defined(_MSC_VER)
#pragma warning(suppress : 6001)
#endif
			mg_free(ctx->dd.config[i]);
		}
	}

	/* Deallocate request handlers */
	while (ctx->dd.handlers) {
		tmp_rh = ctx->dd.handlers;
		ctx->dd.handlers = tmp_rh->next;
		mg_free(tmp_rh->uri);
		mg_free(tmp_rh);
	}

#if defined(USE_MBEDTLS)
	if (ctx->dd.ssl_ctx != NULL) {
		mbed_sslctx_uninit(ctx->dd.ssl_ctx);
		mg_free(ctx->dd.ssl_ctx);
		ctx->dd.ssl_ctx = NULL;
	}

#elif !defined(NO_SSL)
	/* Deallocate SSL context */
	if (ctx->dd.ssl_ctx != NULL) {
		void *ssl_ctx = (void *)ctx->dd.ssl_ctx;
		int callback_ret =
		    (ctx->callbacks.external_ssl_ctx == NULL)
		        ? 0
		        : (ctx->callbacks.external_ssl_ctx(&ssl_ctx, ctx->user_data));

		if (callback_ret == 0) {
			SSL_CTX_free(ctx->dd.ssl_ctx);
		}
		/* else: ignore error and omit SSL_CTX_free in case
		 * callback_ret is 1 */
	}
#endif /* !NO_SSL */

	/* Deallocate worker thread ID array */
	mg_free(ctx->worker_threadids);

	/* Deallocate worker thread ID array */
	mg_free(ctx->worker_connections);

	/* deallocate system name string */
	mg_free(ctx->systemName);

	/* Deallocate context itself */
	mg_free(ctx);
}